

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O0

double __thiscall Preceptron_SIGMOID::Forward(Preceptron_SIGMOID *this)

{
  double dVar1;
  size_type sVar2;
  reference pvVar3;
  double extraout_XMM0_Qa;
  double local_30;
  int local_14;
  int i;
  Preceptron_SIGMOID *this_local;
  
  (this->super_Preceptron).output = 0.0;
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&(this->super_Preceptron).weight);
    if (sVar2 <= (ulong)(long)local_14) break;
    if (((this->super_Preceptron).useBias & 1U) == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Preceptron).weight,(long)local_14);
      local_30 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Preceptron).input,(long)local_14);
      local_30 = local_30 * *pvVar3;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Preceptron).weight,(long)local_14);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Preceptron).input,(long)local_14);
      local_30 = dVar1 * *pvVar3 + (this->super_Preceptron).bias;
    }
    (this->super_Preceptron).output = local_30 + (this->super_Preceptron).output;
    local_14 = local_14 + 1;
  }
  (*(this->super_Preceptron)._vptr_Preceptron[1])((this->super_Preceptron).output);
  (this->super_Preceptron).output = extraout_XMM0_Qa;
  return (this->super_Preceptron).output;
}

Assistant:

double Forward() {
		output = 0.0;
		for (int i = 0; i < weight.size(); i++) {
			output += useBias ? (weight[i] * input[i] + bias) : (weight[i] * input[i]);
		}
		output = Activiation(output);
		return output;
	}